

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::json_sax_dom_callback_parser
          (json_sax_dom_callback_parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *r,parser_callback_t *cb,bool allow_exceptions_)

{
  bool allow_exceptions__local;
  parser_callback_t *cb_local;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *r_local;
  json_sax_dom_callback_parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  this->root = r;
  (this->ref_stack).
  super__Vector_base<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ref_stack).
  super__Vector_base<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ref_stack).
  super__Vector_base<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ::vector(&this->ref_stack);
  (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->keep_stack);
  (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
  ._M_end_of_storage = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->key_keep_stack);
  this->object_element =
       (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  this->errored = false;
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function(&this->callback,cb);
  this->allow_exceptions = allow_exceptions_;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->discarded,discarded);
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->keep_stack,true);
  return;
}

Assistant:

json_sax_dom_callback_parser(BasicJsonType& r,
                                 const parser_callback_t cb,
                                 const bool allow_exceptions_ = true)
        : root(r), callback(cb), allow_exceptions(allow_exceptions_)
    {
        keep_stack.push_back(true);
    }